

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QString>::reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<QString> *this,exception_ptr *error)

{
  QPromise<QString> *pQVar1;
  Data *pDVar2;
  PromiseData<QString> *pPVar3;
  QPromise<QString> *promise;
  exception_ptr *error_local;
  PromiseResolver<QString> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
           operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QString> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QString>).m_d);
    PromiseDataBase<QString,_void_(const_QString_&)>::reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->super_PromiseDataBase<QString,_void_(const_QString_&)>,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QString>).m_d);
    PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QString,_void_(const_QString_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }